

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorNinePatchInstancer::DecoratorNinePatchInstancer(DecoratorNinePatchInstancer *this)

{
  EffectSpecification *this_00;
  code *pcVar1;
  PropertyId PVar2;
  bool bVar3;
  PropertyDefinition *pPVar4;
  allocator<char> local_9c;
  allocator<char> local_9b;
  allocator<char> local_9a;
  allocator<char> local_99;
  String local_98;
  String local_78;
  String local_58;
  String local_38;
  
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorNinePatchInstancer_00396f08;
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"outer",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_9a);
  this_00 = &(this->super_DecoratorInstancer).super_EffectSpecification;
  pPVar4 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"string",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_38,&local_58);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->sprite_outer_id = PVar2;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"inner",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_9a);
  pPVar4 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"string",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_38,&local_58);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->sprite_inner_id = PVar2;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"edge-top",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar4 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"number_length_percent",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_38,&local_58);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[0] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"edge-right",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar4 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"number_length_percent",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_38,&local_58);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[1] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"edge-bottom",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar4 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"number_length_percent",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_38,&local_58);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[2] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"edge-left",&local_99);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"0px",&local_9a);
  pPVar4 = EffectSpecification::RegisterProperty(this_00,&local_78,&local_98);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"number_length_percent",&local_9b);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9c);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_38,&local_58);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[3] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"edge",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"edge-top, edge-right, edge-bottom, edge-left",
             (allocator<char> *)&local_58);
  EffectSpecification::RegisterShorthand(this_00,&local_78,&local_98,Box);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  if ((this->sprite_outer_id == Invalid) || (this->sprite_inner_id == Invalid)) {
    bVar3 = Assert("RMLUI_ASSERT(sprite_outer_id != PropertyId::Invalid && sprite_inner_id != PropertyId::Invalid)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorNinePatch.cpp"
                   ,0xc3);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"decorator",(allocator<char> *)&local_38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"outer, inner, edge?",(allocator<char> *)&local_58);
  EffectSpecification::RegisterShorthand(this_00,&local_78,&local_98,RecursiveCommaSeparated);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

DecoratorNinePatchInstancer::DecoratorNinePatchInstancer()
{
	sprite_outer_id = RegisterProperty("outer", "").AddParser("string").GetId();
	sprite_inner_id = RegisterProperty("inner", "").AddParser("string").GetId();
	edge_ids[0] = RegisterProperty("edge-top", "0px").AddParser("number_length_percent").GetId();
	edge_ids[1] = RegisterProperty("edge-right", "0px").AddParser("number_length_percent").GetId();
	edge_ids[2] = RegisterProperty("edge-bottom", "0px").AddParser("number_length_percent").GetId();
	edge_ids[3] = RegisterProperty("edge-left", "0px").AddParser("number_length_percent").GetId();

	RegisterShorthand("edge", "edge-top, edge-right, edge-bottom, edge-left", ShorthandType::Box);

	RMLUI_ASSERT(sprite_outer_id != PropertyId::Invalid && sprite_inner_id != PropertyId::Invalid);

	RegisterShorthand("decorator", "outer, inner, edge?", ShorthandType::RecursiveCommaSeparated);
}